

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O0

void __thiscall QtMWidgets::Switch::paintEvent(Switch *this,QPaintEvent *param_1)

{
  QPainterPath *this_00;
  State SVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  QColor *pQVar8;
  SwitchPrivate *pSVar9;
  QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
  *pQVar10;
  QColor QVar11;
  QRect local_1e0;
  QPainterPath local_1d0 [8];
  QPainterPath local_1c8 [8];
  QPainterPath glow;
  undefined1 auStack_1b8 [8];
  QColor lightAlphaColor;
  QPainterPath rect;
  undefined6 local_190;
  undefined6 local_188;
  undefined2 local_182;
  undefined6 uStack_180;
  QBrush local_178 [8];
  QBrush local_170 [8];
  undefined6 local_168;
  undefined2 uStack_162;
  undefined6 local_160;
  undefined2 uStack_15a;
  undefined6 local_158;
  undefined2 local_152;
  undefined6 uStack_150;
  undefined6 local_148;
  undefined2 uStack_142;
  undefined6 local_140;
  undefined2 uStack_13a;
  undefined6 local_138;
  undefined2 local_132;
  undefined6 uStack_130;
  undefined6 local_128;
  undefined2 uStack_122;
  undefined6 local_120;
  undefined2 uStack_11a;
  undefined6 local_118;
  undefined2 local_112;
  undefined6 uStack_110;
  QPointF local_108;
  QPointF local_f8;
  QLinearGradient local_e8 [8];
  QLinearGradient g;
  QPainter local_90 [8];
  QPainter p;
  QColor lightColor;
  QColor borderColor;
  QStyleOption local_58 [8];
  QStyleOption opt;
  QRect local_48;
  QPalette local_30 [24];
  QPaintEvent *local_18;
  QPaintEvent *param_1_local;
  Switch *this_local;
  
  local_18 = param_1;
  param_1_local = (QPaintEvent *)this;
  QStyleOption::QStyleOption(local_58,1,0);
  QStyleOption::initFrom((QWidget *)local_58);
  pQVar8 = QPalette::color(local_30,Shadow);
  lightColor._8_8_ = *(undefined8 *)pQVar8;
  pQVar8 = QPalette::color(local_30,Base);
  _p = *(undefined8 *)pQVar8;
  lightColor._0_8_ = *(undefined8 *)((long)&pQVar8->ct + 4);
  QPainter::QPainter(local_90,(QPaintDevice *)&this->field_0x10);
  QPainter::translate(local_90,1.0,1.0);
  QPainter::setRenderHint((RenderHint)local_90,true);
  pSVar9 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(&this->d);
  SVar1 = pSVar9->state;
  if (SVar1 < NotAcceptedCheck) {
    QPointF::QPointF(&local_f8,0.0,0.0);
    QPointF::QPointF(&local_108,0.0,1.0);
    QLinearGradient::QLinearGradient(local_e8,&local_f8,&local_108);
    QGradient::setCoordinateMode((CoordinateMode)local_e8);
    QVar11 = darkerColor((QColor *)&p,0x4b);
    local_128 = QVar11._0_6_;
    uStack_122 = QVar11.ct._2_2_;
    local_120 = QVar11.ct._4_6_;
    uStack_11a = QVar11._14_2_;
    uStack_110 = local_120;
    local_118 = local_128;
    local_112 = uStack_122;
    QGradient::setColorAt(0.0,(QColor *)local_e8);
    QVar11 = darkerColor((QColor *)&p,0x19);
    local_148 = QVar11._0_6_;
    uStack_142 = QVar11.ct._2_2_;
    local_140 = QVar11.ct._4_6_;
    uStack_13a = QVar11._14_2_;
    uStack_130 = local_140;
    local_138 = local_148;
    local_132 = uStack_142;
    QGradient::setColorAt(0.1,(QColor *)local_e8);
    QVar11 = darkerColor((QColor *)&p,10);
    local_168 = QVar11._0_6_;
    uStack_162 = QVar11.ct._2_2_;
    local_160 = QVar11.ct._4_6_;
    uStack_15a = QVar11._14_2_;
    uStack_150 = local_160;
    local_158 = local_168;
    local_152 = uStack_162;
    QGradient::setColorAt(1.0,(QColor *)local_e8);
    QBrush::QBrush(local_170,(QGradient *)local_e8);
    QPainter::setBrush((QBrush *)local_90);
    QBrush::~QBrush(local_170);
    QLinearGradient::~QLinearGradient(local_e8);
  }
  else if (SVar1 == NotAcceptedCheck) {
    pSVar9 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
             ::operator->(&this->d);
    QVar11 = darkerColor(&pSVar9->onColor,0x32);
    local_190 = QVar11.ct._4_6_;
    uStack_180 = local_190;
    local_188 = QVar11._0_6_;
    local_182 = QVar11.ct._2_2_;
    QBrush::QBrush(local_178,(QColor *)&local_188,SolidPattern);
    QPainter::setBrush((QBrush *)local_90);
    QBrush::~QBrush(local_178);
  }
  else if (SVar1 == AcceptedCheck) {
    pSVar9 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
             ::operator->(&this->d);
    QBrush::QBrush((QBrush *)&rect,(QColor *)&pSVar9->onColor,SolidPattern);
    QPainter::setBrush((QBrush *)local_90);
    QBrush::~QBrush((QBrush *)&rect);
  }
  QPainter::setPen((QColor *)local_90);
  this_00 = (QPainterPath *)((long)&lightAlphaColor.ct + 4);
  QPainterPath::QPainterPath(this_00);
  iVar5 = QRect::width(&local_48);
  pQVar10 = &this->d;
  pSVar9 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(pQVar10);
  iVar6 = pSVar9->radius;
  pSVar9 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(pQVar10);
  iVar2 = pSVar9->radius;
  pSVar9 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(pQVar10);
  QPainterPath::addRoundedRect
            (this_00,0.0,0.0,(double)(iVar5 + -2),(double)(iVar6 * 2),(double)iVar2,
             (double)pSVar9->radius,AbsoluteSize);
  QPainter::drawPath((QPainterPath *)local_90);
  pSVar9 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(&this->d);
  SwitchPrivate::drawText
            (pSVar9,local_90,local_58,(QColor *)&p,(QColor *)((long)&lightColor.ct + 4));
  auStack_1b8 = (undefined1  [8])_p;
  lightAlphaColor._0_8_ = lightColor._0_8_;
  QColor::setAlpha((int)auStack_1b8);
  QPainter::setPen((PenStyle)local_90);
  QBrush::QBrush((QBrush *)&glow,(QColor *)auStack_1b8,SolidPattern);
  QPainter::setBrush((QBrush *)local_90);
  QBrush::~QBrush((QBrush *)&glow);
  QPainterPath::QPainterPath(local_1c8);
  pQVar10 = &this->d;
  pSVar9 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(pQVar10);
  iVar6 = pSVar9->radius;
  if (iVar6 < 0) {
    iVar6 = iVar6 + 3;
  }
  pSVar9 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(pQVar10);
  iVar2 = pSVar9->radius;
  iVar7 = QRect::width(&local_48);
  pSVar9 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(pQVar10);
  iVar5 = pSVar9->radius;
  pSVar9 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(pQVar10);
  iVar3 = pSVar9->radius;
  pSVar9 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(pQVar10);
  iVar4 = pSVar9->radius;
  pSVar9 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(pQVar10);
  QPainterPath::addRoundedRect
            (local_1c8,(double)(iVar6 >> 2),(double)iVar2,(double)(iVar7 - iVar5 / 2),
             (double)(iVar3 * 2),(double)(iVar4 / 2),(double)(pSVar9->radius / 2),AbsoluteSize);
  QPainterPath::intersected(local_1d0);
  QPainter::drawPath((QPainterPath *)local_90);
  QPainterPath::~QPainterPath(local_1d0);
  pQVar10 = &this->d;
  pSVar9 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(pQVar10);
  iVar6 = pSVar9->offset;
  pSVar9 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(pQVar10);
  iVar2 = pSVar9->radius;
  pSVar9 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(pQVar10);
  QRect::QRect(&local_1e0,iVar6,0,iVar2 * 2,pSVar9->radius * 2);
  pSVar9 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(pQVar10);
  iVar6 = pSVar9->radius;
  pSVar9 = QScopedPointer<QtMWidgets::SwitchPrivate,_QScopedPointerDeleter<QtMWidgets::SwitchPrivate>_>
           ::operator->(pQVar10);
  drawSliderHandle(local_90,&local_1e0,iVar6,pSVar9->radius,(QColor *)((long)&lightColor.ct + 4),
                   (QColor *)&p);
  QPainterPath::~QPainterPath(local_1c8);
  QPainterPath::~QPainterPath((QPainterPath *)((long)&lightAlphaColor.ct + 4));
  QPainter::~QPainter(local_90);
  QStyleOption::~QStyleOption(local_58);
  return;
}

Assistant:

void
Switch::paintEvent( QPaintEvent * )
{
	QStyleOption opt;
	opt.initFrom( this );

	QColor borderColor = opt.palette.color( QPalette::Shadow );
	QColor lightColor = opt.palette.color( QPalette::Base );

	QPainter p( this );
	p.translate( 1.0, 1.0 );
	p.setRenderHint( QPainter::Antialiasing );

	switch( d->state )
	{
		case NotAcceptedUncheck :
		case AcceptedUncheck :
		{
			QLinearGradient g( QPointF( 0.0, 0.0 ), QPointF( 0.0, 1.0 ) );
			g.setCoordinateMode( QGradient::ObjectBoundingMode );
			g.setColorAt( 0.0, darkerColor( lightColor, 75 ) );
			g.setColorAt( 0.1, darkerColor( lightColor, 25 ) );
			g.setColorAt( 1.0, darkerColor( lightColor, 10 ) );

			p.setBrush( g );
		}
		break;

		case NotAcceptedCheck :
			p.setBrush( darkerColor( d->onColor, 50 ) );
		break;

		case AcceptedCheck :
			p.setBrush( d->onColor );
		break;
	}

	p.setPen( borderColor );

	QPainterPath rect;
	rect.addRoundedRect( 0, 0, opt.rect.width() - 2, d->radius * 2,
		d->radius, d->radius );

	p.drawPath( rect );

	d->drawText( &p, opt, lightColor, borderColor );

	QColor lightAlphaColor = lightColor;
	lightAlphaColor.setAlpha( 50 );

	p.setPen( Qt::NoPen );
	p.setBrush( lightAlphaColor );

	QPainterPath glow;
	glow.addRoundedRect( d->radius / 4, d->radius,
		opt.rect.width() - d->radius / 2, d->radius * 2,
		d->radius / 2, d->radius / 2 );

	p.drawPath( rect.intersected( glow ) );

	drawSliderHandle( &p, QRect( d->offset, 0,
		d->radius * 2, d->radius * 2 ),
			d->radius, d->radius, borderColor, lightColor );
}